

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx *cctx,ZSTD_frameParameters fparams)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_contentSizeFlag,(uint)(fparams.contentSizeFlag != 0));
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_checksumFlag,(uint)(fparams._0_8_ >> 0x20 != 0));
    if (sVar1 < 0xffffffffffffff89) {
      sVar2 = ZSTD_CCtx_setParameter(cctx,ZSTD_c_dictIDFlag,(uint)(fparams.noDictIDFlag == 0));
      sVar1 = 0;
      if (0xffffffffffffff88 < sVar2) {
        sVar1 = sVar2;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx* cctx, ZSTD_frameParameters fparams)
{
    ZSTD_STATIC_ASSERT(sizeof(fparams) == 3 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setFParams");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_contentSizeFlag, fparams.contentSizeFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_checksumFlag, fparams.checksumFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_dictIDFlag, fparams.noDictIDFlag == 0), "");
    return 0;
}